

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

bool __thiscall wasm::Type::isExact(Type *this)

{
  bool bVar1;
  HeapType HVar2;
  
  if ((this->id & 1) == 0 && 6 < this->id) {
    HVar2 = getHeapType(this);
    if (HVar2.id < 0x7d) {
      bVar1 = false;
    }
    else {
      bVar1 = (bool)(((byte)this->id & 4) >> 2);
    }
    return bVar1;
  }
  return false;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }